

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O2

Debug * Corrade::Utility::operator<<(Debug *debug,Flag value)

{
  int iVar1;
  Debug *pDVar2;
  undefined7 in_register_00000031;
  char *value_00;
  
  iVar1 = (int)CONCAT71(in_register_00000031,value);
  switch(iVar1) {
  case 1:
    value_00 = "Utility::Debug::Flag::NoNewlineAtTheEnd";
    break;
  case 2:
    value_00 = "Utility::Debug::Flag::DisableColors";
    break;
  case 4:
    value_00 = "Utility::Debug::Flag::NoSpace";
    break;
  case 8:
    value_00 = "Utility::Debug::Flag::Packed";
    break;
  default:
    if (iVar1 == 0x10) {
      value_00 = "Utility::Debug::Flag::Color";
      break;
    }
    if (iVar1 == 0x80) {
      value_00 = "Utility::Debug::Flag::Hex";
      break;
    }
  case 3:
  case 5:
  case 6:
  case 7:
    pDVar2 = Debug::operator<<(debug,"Utility::Debug::Flag(");
    (pDVar2->_immediateFlags)._value = (pDVar2->_immediateFlags)._value | 0x84;
    debug = Debug::operator<<(pDVar2,value);
    (debug->_immediateFlags)._value = (debug->_immediateFlags)._value | 4;
    value_00 = ")";
  }
  pDVar2 = Debug::operator<<(debug,value_00);
  return pDVar2;
}

Assistant:

Debug& operator<<(Debug& debug, Debug::Flag value) {
    switch(value) {
        /* LCOV_EXCL_START */
        #define _c(value) case Debug::Flag::value: return debug << "Utility::Debug::Flag::" #value;
        _c(NoNewlineAtTheEnd)
        _c(DisableColors)
        _c(NoSpace)
        _c(Packed)
        _c(Color)
        /* Space reserved for Bin and Oct */
        _c(Hex)
        #undef _c
        /* LCOV_EXCL_STOP */
    }

    return debug << "Utility::Debug::Flag(" << Debug::nospace << Debug::hex << static_cast<unsigned char>(value) << Debug::nospace << ")";
}